

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

bool __thiscall ON_NurbsCage::IsPeriodic(ON_NurbsCage *this,int dir)

{
  bool bVar1;
  double *pointA;
  double *pointB;
  ulong uVar2;
  int j;
  int k;
  int k_00;
  int i;
  int d [3];
  ulong local_60;
  uint local_58;
  int local_50;
  int local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (((uint)dir < 3) && (0 < this->m_dim)) {
    uVar2 = (ulong)(uint)dir;
    bVar1 = ON_IsKnotVectorPeriodic
                      (this->m_order[uVar2],this->m_cv_count[uVar2],this->m_knot[uVar2]);
    i = 0;
    if (bVar1) {
      local_58 = 0;
      local_60 = 0;
      *(int *)((long)&local_60 + uVar2 * 4) = (this->m_cv_count[uVar2] - this->m_order[uVar2]) + 1;
      local_48 = local_60 & 0xffffffff;
      uVar2 = local_60 >> 0x20;
      local_38 = (ulong)local_58;
      local_40 = uVar2;
      for (; local_50 = (int)local_48 + i, local_50 < this->m_cv_count[0]; i = i + 1) {
        for (j = 0; local_4c = (int)uVar2 + j, local_4c < this->m_cv_count[1]; j = j + 1) {
          k = 0;
          while (k_00 = (int)local_38 + k, k_00 < this->m_cv_count[2]) {
            pointA = CV(this,i,j,k);
            pointB = CV(this,local_50,local_4c,k_00);
            bVar1 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat,pointA,pointB);
            k = k + 1;
            if (!bVar1) goto LAB_0055fff3;
          }
          uVar2 = local_40;
        }
      }
      i = 1;
    }
  }
  else {
LAB_0055fff3:
    i = 0;
  }
  return SUB41(i,0);
}

Assistant:

bool ON_NurbsCage::IsPeriodic(int dir) const
{
  bool bIsPeriodic = false;
  if ( dir >= 0 && dir <= 2 && m_dim > 0 )
  {
    bIsPeriodic = ON_IsKnotVectorPeriodic( m_order[dir], m_cv_count[dir], m_knot[dir] );
    if ( bIsPeriodic ) 
    {
      const double *cv0, *cv1;
      int i,j,k,d[3] = {0,0,0};
      d[dir] = m_cv_count[dir] - (m_order[dir]-1);
      for ( i = 0; i+d[0] < m_cv_count[0]; i++ )
      {
        for ( j = 0; j+d[1] < m_cv_count[1]; j++ )
        {
          for ( k = 0; k+d[2] < m_cv_count[2]; k++ )
          {
            cv0 = CV(i,j,k);
            cv1 = CV(i+d[0],j+d[1],k+d[2]);
            if ( false == ON_PointsAreCoincident(m_dim, m_is_rat, cv0, cv1 ) )
              return false;
          }
        }
      }
    }
  }
  return bIsPeriodic;
}